

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_listen(nng_socket sid,char *addr,nng_listener *lp,int flags)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *local_38;
  nni_sock *s;
  nni_listener *l;
  
  iVar1 = nni_sock_find(&local_38,sid.id);
  if (iVar1 == 0) {
    iVar1 = nni_listener_create((nni_listener **)&s,local_38,addr);
    if (iVar1 == 0) {
      iVar1 = nni_listener_start((nni_listener *)s,flags);
      if (iVar1 == 0) {
        if (lp != (nng_listener *)0x0) {
          uVar2 = nni_listener_id((nni_listener *)s);
          lp->id = uVar2;
        }
        nni_listener_rele((nni_listener *)s);
        iVar1 = 0;
      }
      else {
        nni_listener_close((nni_listener *)s);
      }
    }
    else {
      nni_sock_rele(local_38);
    }
  }
  return iVar1;
}

Assistant:

int
nng_listen(nng_socket sid, const char *addr, nng_listener *lp, int flags)
{
	int           rv;
	nni_sock     *s;
	nni_listener *l;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_listener_create(&l, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	if ((rv = nni_listener_start(l, flags)) != 0) {
		nni_listener_close(l);
		return (rv);
	}

	if (lp != NULL) {
		nng_listener lid;
		lid.id = nni_listener_id(l);
		*lp    = lid;
	}
	nni_listener_rele(l);
	return (rv);
}